

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ssize_t __thiscall Jupiter::Socket::recv(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int __fd_00;
  char *__buf_00;
  size_t __n_00;
  ulong uVar1;
  int r;
  Socket *this_local;
  
  Buffer::clear(&this->m_data->buffer);
  __fd_00 = this->m_data->rawSock;
  __buf_00 = Buffer::chr_data(&this->m_data->buffer);
  __n_00 = Buffer::capacity(&this->m_data->buffer);
  uVar1 = ::recv(__fd_00,__buf_00,__n_00,0);
  if (0 < (int)uVar1) {
    Buffer::set_length(&this->m_data->buffer,(long)(int)uVar1);
  }
  return uVar1 & 0xffffffff;
}

Assistant:

int Jupiter::Socket::recv() {
	m_data->buffer.clear();
	int r = ::recv(m_data->rawSock, m_data->buffer.chr_data(), m_data->buffer.capacity(), 0);
	if (r > 0) {
		m_data->buffer.set_length(r);
	}
	return r;
}